

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlBufferPtr xmlBufferCreateSize(size_t size)

{
  void *pvVar1;
  int local_28;
  xmlBufferPtr ret;
  size_t size_local;
  
  if (size < 0x7fffffff) {
    size_local = (size_t)(*xmlMalloc)(0x20);
    if ((undefined8 *)size_local == (undefined8 *)0x0) {
      size_local = 0;
    }
    else {
      *(undefined4 *)(size_local + 8) = 0;
      *(undefined4 *)(size_local + 0x10) = 3;
      if (size == 0) {
        local_28 = 0;
      }
      else {
        local_28 = (int)size + 1;
      }
      *(int *)(size_local + 0xc) = local_28;
      if (*(int *)(size_local + 0xc) == 0) {
        *(undefined8 *)(size_local + 0x18) = 0;
        *(undefined8 *)size_local = 0;
      }
      else {
        pvVar1 = (*xmlMalloc)((size_t)*(undefined4 *)(size_local + 0xc));
        *(void **)(size_local + 0x18) = pvVar1;
        if (*(long *)(size_local + 0x18) == 0) {
          (*xmlFree)((void *)size_local);
          size_local = 0;
        }
        else {
          *(undefined8 *)size_local = *(undefined8 *)(size_local + 0x18);
          **(undefined1 **)size_local = 0;
        }
      }
    }
  }
  else {
    size_local = 0;
  }
  return (xmlBufferPtr)size_local;
}

Assistant:

xmlBufferPtr
xmlBufferCreateSize(size_t size) {
    xmlBufferPtr ret;

    if (size >= INT_MAX)
        return(NULL);

    ret = xmlMalloc(sizeof(*ret));
    if (ret == NULL)
        return(NULL);

    ret->use = 0;
    ret->alloc = XML_BUFFER_ALLOC_IO;
    ret->size = (size ? size + 1 : 0);         /* +1 for ending null */

    if (ret->size) {
        ret->contentIO = xmlMalloc(ret->size);
        if (ret->contentIO == NULL) {
            xmlFree(ret);
            return(NULL);
        }
        ret->content = ret->contentIO;
        ret->content[0] = 0;
    } else {
        ret->contentIO = NULL;
	ret->content = NULL;
    }

    return(ret);
}